

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::is_builtin_type(Compiler *this,SPIRType *type)

{
  bool *pbVar1;
  bool bVar2;
  Meta *pMVar3;
  long lVar4;
  Decoration *pDVar5;
  
  pMVar3 = ParsedIR::find_meta(&this->ir,(ID)(type->super_IVariant).self.id);
  if (pMVar3 == (Meta *)0x0) {
    bVar2 = false;
  }
  else {
    pDVar5 = (pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    lVar4 = (pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size * 0x160;
    do {
      bVar2 = lVar4 != 0;
      if (lVar4 == 0) {
        return bVar2;
      }
      lVar4 = lVar4 + -0x160;
      pbVar1 = &pDVar5->builtin;
      pDVar5 = pDVar5 + 1;
    } while (*pbVar1 != true);
  }
  return bVar2;
}

Assistant:

bool Compiler::is_builtin_type(const SPIRType &type) const
{
	auto *type_meta = ir.find_meta(type.self);

	// We can have builtin structs as well. If one member of a struct is builtin, the struct must also be builtin.
	if (type_meta)
		for (auto &m : type_meta->members)
			if (m.builtin)
				return true;

	return false;
}